

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int x509_get_current_time(mbedtls_x509_time *now)

{
  tm *ptVar1;
  int iVar2;
  time_t tt;
  time_t local_18;
  
  iVar2 = 0;
  local_18 = time((time_t *)0x0);
  ptVar1 = gmtime(&local_18);
  if (ptVar1 == (tm *)0x0) {
    iVar2 = -1;
  }
  else {
    now->year = ptVar1->tm_year + 0x76c;
    now->mon = ptVar1->tm_mon + 1;
    now->day = ptVar1->tm_mday;
    now->hour = ptVar1->tm_hour;
    now->min = ptVar1->tm_min;
    now->sec = ptVar1->tm_sec;
  }
  return iVar2;
}

Assistant:

static int x509_get_current_time( mbedtls_x509_time *now )
{
    struct tm *lt;
    time_t tt;
    int ret = 0;

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_lock( &mbedtls_threading_gmtime_mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    tt = time( NULL );
    lt = gmtime( &tt );

    if( lt == NULL )
        ret = -1;
    else
    {
        now->year = lt->tm_year + 1900;
        now->mon  = lt->tm_mon  + 1;
        now->day  = lt->tm_mday;
        now->hour = lt->tm_hour;
        now->min  = lt->tm_min;
        now->sec  = lt->tm_sec;
    }

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &mbedtls_threading_gmtime_mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}